

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float *pfVar1;
  ma_vec3f a;
  ma_vec3f b;
  ma_vec3f a_00;
  ma_vec3f dirB;
  ma_vec3f dirB_00;
  ma_vec3f dirA;
  ma_vec3f dirA_00;
  ma_vec3f listenVelocity;
  ma_vec3f sourceVelocity;
  ma_vec3f relativePosition;
  ma_vec3f a_01;
  ma_channel channelPosition;
  ma_bool32 mVar2;
  ma_positioning mVar3;
  float fVar4;
  ma_spatializer_listener *in_RSI;
  ma_spatializer *in_RDI;
  ma_channel *in_R8;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ma_vec3f mVar12;
  ma_vec3f *in_stack_00000008;
  ma_vec3f *in_stack_00000010;
  ma_spatializer_listener *in_stack_00000018;
  ma_spatializer *in_stack_00000020;
  float dMin;
  float d;
  ma_channel channelOut;
  float distanceInv_1;
  ma_vec3f unitPos;
  float listenerOuterGain;
  float listenerOuterAngle;
  float listenerInnerAngle;
  ma_vec3f listenerDirection;
  float spatializerConeOuterGain;
  float spatializerConeOuterAngle;
  float spatializerConeInnerAngle;
  float distanceInv;
  float dopplerFactor;
  float rolloff;
  float maxDistance;
  float minDistance;
  ma_uint32 channelsIn;
  ma_uint32 channelsOut;
  ma_uint32 iChannel;
  float gain;
  float distance;
  float speedOfSound;
  ma_vec3f listenerVel;
  ma_vec3f relativeDir;
  ma_vec3f relativePos;
  ma_vec3f relativePosNormalized;
  ma_channel *pChannelMapOut;
  ma_channel *pChannelMapIn;
  float r1;
  float r0;
  ma_uint32 in_stack_00000dac;
  ma_channel *in_stack_00000db0;
  float *in_stack_00000db8;
  ma_uint32 in_stack_00000dc4;
  ma_channel *in_stack_00000dc8;
  float *in_stack_00000dd0;
  ma_uint64 in_stack_00000de0;
  ma_channel_mix_mode in_stack_00000de8;
  ma_mono_expansion_mode in_stack_00000df0;
  ma_channel *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc04;
  float in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  float in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  float in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  float in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  float fVar13;
  undefined8 in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc54;
  float in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  undefined8 in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc90;
  float in_stack_fffffffffffffca4;
  undefined8 local_338;
  float local_330;
  undefined8 local_318;
  float local_310;
  undefined8 uVar14;
  float local_298;
  undefined8 local_28c;
  float local_17c;
  float local_178;
  float local_174;
  ma_vec3f local_170;
  undefined8 local_160;
  float local_158;
  float local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  ma_vec3f local_130;
  undefined8 local_11c;
  float local_114;
  ma_vec3f local_110;
  undefined8 local_100;
  float local_f8;
  ma_vec3f local_f0;
  undefined8 local_dc;
  float local_d4;
  ma_vec3f local_d0;
  undefined8 local_bc;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  ma_uint32 local_a0;
  ma_uint32 local_9c;
  uint local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined8 local_88;
  float local_80;
  undefined8 local_7c;
  float local_74;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  ma_attenuation_model local_54;
  ma_channel *local_50;
  ma_channel *local_48;
  ma_channel *local_40;
  ma_spatializer_listener *local_28;
  ma_spatializer *local_20;
  ma_result local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  local_48 = in_RDI->pChannelMapIn;
  local_50 = (in_RSI->config).pChannelMapOut;
  if (in_RDI == (ma_spatializer *)0x0) {
    local_18 = MA_INVALID_ARGS;
  }
  else {
    local_54 = in_RDI->attenuationModel;
    local_20 = in_RDI;
    if (local_54 == ma_attenuation_model_none) {
      mVar2 = ma_spatializer_listener_is_enabled(in_RSI);
      if (mVar2 == 0) {
        ma_silence_pcm_frames
                  ((void *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (ma_format)in_stack_fffffffffffffc1c,(ma_uint32)in_stack_fffffffffffffc18);
      }
      else if (local_20->channelsIn == local_20->channelsOut) {
        ma_copy_pcm_frames((void *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                           (ma_format)in_stack_fffffffffffffc0c,(ma_uint32)in_stack_fffffffffffffc08
                          );
      }
      else {
        ma_channel_map_apply_f32
                  (in_stack_00000dd0,in_stack_00000dc8,in_stack_00000dc4,in_stack_00000db8,
                   in_stack_00000db0,in_stack_00000dac,in_stack_00000de0,in_stack_00000de8,
                   in_stack_00000df0);
      }
      local_20->dopplerPitch = 1.0;
    }
    else {
      local_90 = 0.0;
      local_94 = 1.0;
      local_9c = in_RDI->channelsOut;
      local_a0 = in_RDI->channelsIn;
      local_40 = in_R8;
      local_28 = in_RSI;
      local_a4 = ma_spatializer_get_min_distance(in_RDI);
      local_a8 = ma_spatializer_get_max_distance(local_20);
      local_ac = ma_spatializer_get_rolloff(local_20);
      local_b0 = ma_spatializer_get_doppler_factor(local_20);
      if (local_28 == (ma_spatializer_listener *)0x0) {
        mVar12 = ma_vec3f_init_3f(0.0,0.0,0.0);
        local_f0._0_8_ = mVar12._0_8_;
        local_dc._0_4_ = local_f0.x;
        local_dc._4_4_ = local_f0.y;
        local_f0.z = mVar12.z;
        local_d4 = local_f0.z;
        local_88._0_4_ = local_f0.x;
        local_88._4_4_ = local_f0.y;
        local_80 = local_f0.z;
        local_8c = 343.3;
        local_f0 = mVar12;
      }
      else {
        mVar12 = ma_spatializer_listener_get_velocity
                           ((ma_spatializer_listener *)
                            CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
        local_d0._0_8_ = mVar12._0_8_;
        local_bc._0_4_ = local_d0.x;
        local_bc._4_4_ = local_d0.y;
        local_d0.z = mVar12.z;
        local_b4 = local_d0.z;
        local_88._0_4_ = local_d0.x;
        local_88._4_4_ = local_d0.y;
        local_80 = local_d0.z;
        local_8c = (local_28->config).speedOfSound;
        local_d0 = mVar12;
      }
      if ((local_28 == (ma_spatializer_listener *)0x0) ||
         (mVar3 = ma_spatializer_get_positioning(local_20), mVar3 == ma_positioning_relative)) {
        mVar12 = ma_spatializer_get_position
                           ((ma_spatializer *)
                            CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
        local_110.z = mVar12.z;
        local_f8 = local_110.z;
        local_110._0_8_ = mVar12._0_8_;
        local_100._0_4_ = local_110.x;
        local_100._4_4_ = local_110.y;
        local_68 = local_110.z;
        local_70._0_4_ = local_110.x;
        local_70._4_4_ = local_110.y;
        local_110 = mVar12;
        mVar12 = ma_spatializer_get_direction
                           ((ma_spatializer *)
                            CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
        local_130._0_8_ = mVar12._0_8_;
        local_11c._0_4_ = local_130.x;
        local_11c._4_4_ = local_130.y;
        local_130.z = mVar12.z;
        local_114 = local_130.z;
        local_7c._0_4_ = local_130.x;
        local_7c._4_4_ = local_130.y;
        local_74 = local_130.z;
        local_130 = mVar12;
      }
      else {
        ma_spatializer_get_relative_position_and_direction
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
      }
      local_138 = local_68;
      local_140 = local_70;
      local_148 = local_68;
      local_150 = local_70;
      mVar12.y = (float)in_stack_fffffffffffffc24;
      mVar12.x = (float)in_stack_fffffffffffffc20;
      mVar12.z = in_stack_fffffffffffffc28;
      local_90 = ma_vec3f_len(mVar12);
      fVar4 = (float)ma_spatializer_get_attenuation_model(local_20);
      switch(fVar4) {
      case 0.0:
      default:
        local_94 = 1.0;
        break;
      case 1.4013e-45:
        local_94 = ma_attenuation_inverse(local_90,local_a4,local_a8,local_ac);
        break;
      case 2.8026e-45:
        local_94 = ma_attenuation_linear(local_90,local_a4,local_a8,local_ac);
        break;
      case 4.2039e-45:
        local_94 = ma_attenuation_exponential
                             (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                              in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
      }
      if (local_90 <= 0.001) {
        local_90 = 0.0;
        mVar12 = ma_vec3f_init_3f(0.0,0.0,0.0);
        local_170._0_8_ = mVar12._0_8_;
        local_160._0_4_ = local_170.x;
        local_160._4_4_ = local_170.y;
        local_170.z = mVar12.z;
        local_158 = local_170.z;
        local_60._0_4_ = local_170.x;
        local_60._4_4_ = local_170.y;
        local_58 = local_170.z;
        local_170 = mVar12;
      }
      else {
        local_154 = 1.0 / local_90;
        local_60._0_4_ = (float)local_70;
        local_60._4_4_ = (float)((ulong)local_70 >> 0x20);
        local_60 = CONCAT44(local_154 * local_60._4_4_,local_154 * (float)local_60);
        local_58 = local_154 * local_68;
      }
      if (0.0 < local_90) {
        ma_spatializer_get_cone(local_20,&local_174,&local_178,&local_17c);
        a.y = (float)in_stack_fffffffffffffc2c;
        a.x = in_stack_fffffffffffffc28;
        a.z = fVar4;
        ma_vec3f_neg(a);
        dirA.z = in_stack_fffffffffffffc90;
        dirA.x = (float)(int)in_stack_fffffffffffffc88;
        dirA.y = (float)(int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
        dirB.y = (float)in_stack_fffffffffffffc70;
        dirB.x = (float)in_stack_fffffffffffffc6c;
        dirB.z = in_stack_fffffffffffffc74;
        fVar5 = ma_calculate_angular_gain
                          (dirA,dirB,in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
                           in_stack_fffffffffffffc50);
        local_94 = fVar5 * local_94;
        if ((local_28 != (ma_spatializer_listener *)0x0) &&
           (pfVar1 = &(local_28->config).coneInnerAngleInRadians,
           *pfVar1 <= 6.283185 && *pfVar1 != 6.283185)) {
          if ((local_28->config).handedness == ma_handedness_right) {
            ma_vec3f_init_3f(0.0,0.0,-1.0);
          }
          else {
            ma_vec3f_init_3f(0.0,0.0,1.0);
          }
          dirA_00.z = in_stack_fffffffffffffc90;
          dirA_00.x = (float)(int)in_stack_fffffffffffffc88;
          dirA_00.y = (float)(int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
          dirB_00.y = (float)in_stack_fffffffffffffc70;
          dirB_00.x = (float)in_stack_fffffffffffffc6c;
          dirB_00.z = in_stack_fffffffffffffc74;
          fVar5 = ma_calculate_angular_gain
                            (dirA_00,dirB_00,in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
                             in_stack_fffffffffffffc50);
          local_94 = fVar5 * local_94;
        }
      }
      fVar6 = ma_spatializer_get_min_gain(local_20);
      fVar13 = local_94;
      fVar7 = ma_spatializer_get_max_gain(local_20);
      fVar5 = local_94;
      if (fVar7 <= fVar13) {
        fVar5 = ma_spatializer_get_max_gain(local_20);
      }
      if (fVar6 <= fVar5) {
        in_stack_fffffffffffffc1c = local_94;
        fVar8 = ma_spatializer_get_max_gain(local_20);
        in_stack_fffffffffffffc18 = local_94;
        fVar7 = local_94;
        if (fVar8 <= in_stack_fffffffffffffc1c) {
          in_stack_fffffffffffffc18 = ma_spatializer_get_max_gain(local_20);
          fVar7 = in_stack_fffffffffffffc18;
        }
      }
      else {
        fVar7 = ma_spatializer_get_min_gain(local_20);
      }
      for (local_98 = 0; local_98 < local_9c; local_98 = local_98 + 1) {
        local_20->pNewChannelGainsOut[local_98] = fVar7;
      }
      local_94 = fVar7;
      mVar2 = ma_spatializer_listener_is_enabled(local_28);
      if (mVar2 == 0) {
        ma_silence_pcm_frames
                  ((void *)CONCAT44(fVar13,fVar6),CONCAT44(fVar5,fVar7),
                   (ma_format)in_stack_fffffffffffffc1c,(ma_uint32)in_stack_fffffffffffffc18);
      }
      else {
        in_stack_fffffffffffffc00 = 0;
        in_stack_fffffffffffffc08 = 0.0;
        ma_channel_map_apply_f32
                  (in_stack_00000dd0,in_stack_00000dc8,in_stack_00000dc4,in_stack_00000db8,
                   in_stack_00000db0,in_stack_00000dac,in_stack_00000de0,in_stack_00000de8,
                   in_stack_00000df0);
        in_stack_fffffffffffffbf8 = local_40;
      }
      if (0.0 < local_90) {
        fVar8 = 1.0 / local_90;
        local_28c._0_4_ = (float)local_70;
        local_28c._4_4_ = (float)((ulong)local_70 >> 0x20);
        fVar9 = fVar8 * local_68;
        for (local_98 = 0; local_98 < local_9c; local_98 = local_98 + 1) {
          channelPosition = ma_channel_map_get_channel(in_stack_fffffffffffffbf8,0,0x1cdedf);
          mVar2 = ma_is_spatial_channel_position(channelPosition);
          if (mVar2 == 0) {
            local_298 = 1.0;
          }
          else {
            mVar12 = ma_get_channel_direction((ma_channel)((uint)in_stack_fffffffffffffc18 >> 0x18))
            ;
            a_01.z = fVar9;
            a_01.x = fVar8 * (float)local_28c;
            a_01.y = fVar8 * local_28c._4_4_;
            fVar10 = ma_vec3f_dot(a_01,mVar12);
            local_c = ma_spatializer_get_directional_attenuation_factor(local_20);
            local_4 = 0x3f800000;
            local_10 = fVar10 - 1.0;
            local_14 = local_10 * local_c;
            local_298 = local_14 + 1.0;
            local_8 = fVar10;
          }
          fVar10 = local_20->minSpatializationChannelGain;
          fVar11 = (local_298 + 1.0) * 0.5;
          if (fVar10 < fVar11) {
            fVar10 = fVar11;
          }
          local_20->pNewChannelGainsOut[local_98] = fVar10 * local_20->pNewChannelGainsOut[local_98]
          ;
        }
      }
      ma_gainer_set_gains((ma_gainer *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
                          ,(float *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      ma_gainer_process_pcm_frames
                ((ma_gainer *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (void *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 in_stack_fffffffffffffbf8,0x1ce16c);
      if (local_b0 <= 0.0) {
        local_20->dopplerPitch = 1.0;
      }
      else {
        mVar12 = ma_spatializer_listener_get_position
                           ((ma_spatializer_listener *)CONCAT44(fVar5,fVar7));
        local_310 = mVar12.z;
        local_318 = mVar12._0_8_;
        mVar12 = ma_spatializer_get_position((ma_spatializer *)CONCAT44(fVar5,fVar7));
        local_330 = mVar12.z;
        local_338 = mVar12._0_8_;
        a_00.z = in_stack_fffffffffffffc50;
        a_00.x = (float)(int)in_stack_fffffffffffffc48;
        a_00.y = (float)(int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
        b.y = fVar13;
        b.x = fVar6;
        b.z = fVar4;
        uVar14 = local_318;
        fVar4 = local_310;
        mVar12 = ma_vec3f_sub(a_00,b);
        ma_spatializer_get_velocity((ma_spatializer *)CONCAT44(fVar5,fVar7));
        relativePosition.z = fVar4;
        relativePosition.x = (float)(int)uVar14;
        relativePosition.y = (float)(int)((ulong)uVar14 >> 0x20);
        sourceVelocity.z = local_330;
        sourceVelocity.x = (float)(int)local_338;
        sourceVelocity.y = (float)(int)((ulong)local_338 >> 0x20);
        listenVelocity.z = local_310;
        listenVelocity.x = (float)(int)local_318;
        listenVelocity.y = (float)(int)((ulong)local_318 >> 0x20);
        fVar4 = ma_doppler_pitch(relativePosition,sourceVelocity,listenVelocity,
                                 in_stack_fffffffffffffca4,mVar12.z);
        local_20->dopplerPitch = fVar4;
      }
    }
    local_18 = MA_SUCCESS;
  }
  return local_18;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (ma_atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The velocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = ma_spatializer_listener_get_velocity(pListener);
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = ma_spatializer_get_position(pSpatializer);
            relativeDir = ma_spatializer_get_direction(pSpatializer);
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source angular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        The gain needs to be applied per-channel here. The spatialization code below will be changing the per-channel
        gains which will then eventually be passed into the gainer which will deal with smoothing the gain transitions
        to avoid harsh changes in gain.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }


        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = pSpatializer->minSpatializationChannelGain;

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(ma_spatializer_listener_get_position(pListener), ma_spatializer_get_position(pSpatializer)), ma_spatializer_get_velocity(pSpatializer), listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}